

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_function_queue.h
# Opt level: O0

bool __thiscall
density::
sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
::try_reentrant_consume_impl
          (sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
           *this)

{
  bool bVar1;
  FunctionRuntimeType<(density::function_type_erasure)0,_void_()> *this_00;
  void *i_dest;
  undefined1 local_30 [8];
  reentrant_consume_operation cons;
  sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  *this_local;
  
  cons.m_consume_data.m_next_ptr = (uintptr_t)this;
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::try_start_reentrant_consume((reentrant_consume_operation *)local_30,&this->m_queue);
  bVar1 = density::sp_heter_queue::reentrant_consume_operation::operator_cast_to_bool
                    ((reentrant_consume_operation *)local_30);
  if (bVar1) {
    this_00 = sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
              ::reentrant_consume_operation::complete_type((reentrant_consume_operation *)local_30);
    i_dest = sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
             ::reentrant_consume_operation::unaligned_element_ptr
                       ((reentrant_consume_operation *)local_30);
    detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>::align_invoke_destroy
              (this_00,i_dest);
    sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::reentrant_consume_operation::commit_nodestroy((reentrant_consume_operation *)local_30);
  }
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::reentrant_consume_operation::~reentrant_consume_operation
            ((reentrant_consume_operation *)local_30);
  return bVar1;
}

Assistant:

bool try_reentrant_consume_impl(std::true_type, PARAMS... i_params)
        {
            if (auto cons = m_queue.try_start_reentrant_consume())
            {
                cons.complete_type().align_invoke_destroy(
                  cons.unaligned_element_ptr(), std::forward<PARAMS>(i_params)...);
                cons.commit_nodestroy();
                return true;
            }
            else
            {
                return false;
            }
        }